

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
          (iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar1;
  ulong uVar2;
  undefined1 key_byte;
  value_type vVar3;
  value_type vVar4;
  uint uVar5;
  int iVar6;
  node_ptr nVar7;
  stack_entry *psVar8;
  node_ptr aleaf;
  iterator *piVar9;
  undefined7 in_register_00000009;
  void *extraout_RDX;
  node_type nVar10;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbVar11;
  find_result fVar12;
  undefined1 local_a0 [8];
  iter_result_opt_conflict cnxt;
  iter_result_opt_conflict nxt;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  local_58;
  key_prefix_snapshot key_prefix;
  art_key_type remaining_key;
  
  invalidate(this);
  *match = false;
  aleaf.tagged_ptr = (this->db_->root).tagged_ptr;
  if (aleaf.tagged_ptr != 0) {
    remaining_key.field_0.key._4_4_ = (undefined4)CONCAT71(in_register_00000009,fwd);
    key_prefix = (key_prefix_snapshot)search_key.field_0;
    while( true ) {
      pbVar11 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(aleaf.tagged_ptr & 0xfffffffffffffff8);
      nVar10 = (node_type)aleaf.tagged_ptr & (I256|I48);
      if ((aleaf.tagged_ptr & 7) == 0) break;
      kVar1 = pbVar11->k_prefix;
      local_58 = kVar1;
      uVar5 = detail::key_prefix_snapshot::get_shared_length
                        ((key_prefix_snapshot *)&local_58.f,key_prefix.u64);
      if (uVar5 < kVar1.f.key_prefix_length.value.value) {
        vVar3 = detail::basic_art_key<unsigned_long>::operator[]
                          ((basic_art_key<unsigned_long> *)&key_prefix.f,(ulong)uVar5);
        vVar4 = detail::key_prefix_snapshot::operator[]
                          ((key_prefix_snapshot *)&local_58.f,(ulong)uVar5);
        if (vVar3 == vVar4) {
          __assert_fail("cmp_ != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x4ce,
                        "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        if (remaining_key.field_0.key_bytes._M_elems[4] != 0) {
          if (vVar3 < vVar4) {
LAB_0012bb51:
            piVar9 = left_most_traversal(this,(node_ptr)aleaf.tagged_ptr);
            return piVar9;
          }
          this = right_most_traversal(this,(node_ptr)aleaf.tagged_ptr);
          goto LAB_0012ba45;
        }
        if (vVar4 <= vVar3) {
LAB_0012bb73:
          piVar9 = right_most_traversal(this,(node_ptr)aleaf.tagged_ptr);
          return piVar9;
        }
        this = left_most_traversal(this,(node_ptr)aleaf.tagged_ptr);
        goto LAB_0012ba2f;
      }
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&key_prefix.f,(ulong)kVar1 >> 0x38);
      key_byte = key_prefix.f.key_prefix._M_elems[0];
      fVar12 = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::find_child(pbVar11,nVar10,key_prefix.f.key_prefix._M_elems[0]);
      if (fVar12.second ==
          (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *)
          0x0) {
        if (remaining_key.field_0.key_bytes._M_elems[4] != 0) {
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::gte_key_byte((iter_result_opt_conflict *)
                         &cnxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                          ._M_engaged,pbVar11,nVar10,key_byte);
          if (nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _M_payload._16_1_ == '\0') {
            if ((this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                (this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              pop(this);
            }
            while( true ) {
              if ((this->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  (this->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                return this;
              }
              psVar8 = top(this);
              uVar2 = (psVar8->node).tagged_ptr;
              pbVar11 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         *)(uVar2 & 0xfffffffffffffff8);
              nVar10 = (node_type)uVar2;
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::next((iter_result_opt_conflict *)local_a0,pbVar11,nVar10 & (I256|I48),
                     psVar8->child_index);
              if (cnxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._16_1_ == '\x01') break;
              pop(this);
            }
            aleaf = detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    ::get_child(pbVar11,nVar10 & (I256|I48),psVar8->child_index);
          }
          else {
            nVar7 = detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                    ::get_child(pbVar11,nVar10,
                                nxt.
                                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                                ._M_payload._M_value.node.tagged_ptr._1_1_);
            push(this,(node_ptr)aleaf.tagged_ptr,
                 nxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                 ._M_payload._M_value.node.tagged_ptr._0_1_,
                 nxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                 ._M_payload._M_value.node.tagged_ptr._1_1_,
                 (key_prefix_snapshot)
                 nxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                 ._M_payload._8_8_);
            aleaf = nVar7;
          }
          goto LAB_0012bb51;
        }
        detail::
        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ::lte_key_byte((iter_result_opt_conflict *)
                       &cnxt.
                        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                        ._M_engaged,pbVar11,nVar10,key_byte);
        if (nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
            _M_payload._16_1_ == '\0') {
          if ((this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              (this->stack_).c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            pop(this);
          }
          while( true ) {
            if ((this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                (this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              return this;
            }
            psVar8 = top(this);
            uVar2 = (psVar8->node).tagged_ptr;
            pbVar11 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                       *)(uVar2 & 0xfffffffffffffff8);
            nVar10 = (node_type)uVar2;
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::prior((iter_result_opt_conflict *)local_a0,pbVar11,nVar10 & (I256|I48),
                    psVar8->child_index);
            if (cnxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._16_1_ == '\x01') break;
            pop(this);
          }
          aleaf = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_child(pbVar11,nVar10 & (I256|I48),psVar8->child_index);
        }
        else {
          nVar7 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_child(pbVar11,nVar10,
                              nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                              ._M_payload._M_value.node.tagged_ptr._1_1_);
          push(this,(node_ptr)aleaf.tagged_ptr,
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._M_value.node.tagged_ptr._0_1_,
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._M_value.node.tagged_ptr._1_1_,
               (key_prefix_snapshot)
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload._8_8_);
          aleaf = nVar7;
        }
        goto LAB_0012bb73;
      }
      push(this,(node_ptr)aleaf.tagged_ptr,key_byte,fVar12.first,(key_prefix_snapshot)local_58);
      aleaf.tagged_ptr = ((fVar12.second)->value).tagged_ptr;
      key_prefix.u64 = key_prefix.u64 >> 8;
    }
    push_leaf(this,(node_ptr)aleaf.tagged_ptr);
    iVar6 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                      ((basic_leaf<unsigned_long,_unodb::detail::node_header> *)pbVar11,
                       (void *)search_key.field_0,extraout_RDX);
    if (iVar6 == 0) {
      *match = true;
    }
    else if (remaining_key.field_0.key_bytes._M_elems[4] == 0) {
      if (iVar6 < 1) {
LAB_0012ba2f:
        this = prior(this);
      }
    }
    else if (-1 < iVar6) {
LAB_0012ba45:
      this = next(this);
    }
  }
  return this;
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::seek(
    art_key_type search_key, bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // aka end()

  auto node{db_.root};
  const auto k = search_key;
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      push_leaf(node);
      const auto cmp_ = leaf->cmp(k);
      if (cmp_ == 0) {
        match = true;
        return *this;
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use the leaf, else next().
        return (cmp_ < 0) ? *this : next();
      }
      // LTE semantics: if search_key > leaf, use the leaf, else prior().
      return (cmp_ > 0) ? *this : prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return left_most_traversal(node);
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return right_most_traversal(node).next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return left_most_traversal(node).prior();
      }
      // REV and the search key is ordered after this node.
      return right_most_traversal(node);
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // possible parent from the stack
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(cnode.type(), centry.child_index);
              return left_most_traversal(nchild);
            }
            pop();
          }
          return *this;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child = inode->get_child(node_type, child_index);
        push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
        return left_most_traversal(child);  // left most traversal
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // possible parent from stack
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(cnode.type(), centry.child_index);
            return right_most_traversal(nchild);
          }
          pop();
        }
        return *this;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index{tmp.child_index};
      const auto child = inode->get_child(node_type, child_index);
      push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
      return right_most_traversal(child);  // right most traversal
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    push(node, remaining_key[0], child_index, key_prefix);
    node = *child;
    remaining_key.shift_right(1);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}